

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riotUnits.c
# Opt level: O2

UnitNode * pop(UnitList *stack)

{
  UnitNode *pUVar1;
  UnitNode *pUVar2;
  UnitNode *pUVar3;
  
  pUVar3 = stack->head;
  if (stack->count == 0) {
    pUVar2 = (UnitNode *)0x0;
  }
  else {
    pUVar1 = pUVar3->next;
    stack->count = stack->count + -1;
    stack->head = pUVar1;
    pUVar2 = pUVar3;
    pUVar3 = pUVar1;
  }
  if (pUVar3 != (UnitNode *)0x0) {
    pUVar3->prev = (UnitNode *)0x0;
  }
  return pUVar2;
}

Assistant:

struct UnitNode *pop(struct UnitList *stack) {

    struct UnitNode *tempNode, *request = NULL;

    if (stack->count) {
        tempNode = stack->head->next;
        request = stack->head;
        stack->count--;
        stack->head = tempNode;
    }

    if (stack->head)
        stack->head->prev = NULL;

    return request;
}